

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O0

int set_start_bits(pcre2_real_code_8 *re,PCRE2_SPTR8 code,BOOL utf)

{
  bool bVar1;
  uint table_limit_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *local_80;
  byte local_5e [2];
  int d;
  uint32_t *puStack_58;
  PCRE2_UCHAR8 buff [6];
  uint32_t *p;
  uint8_t *classmap;
  byte *pbStack_40;
  int rc;
  PCRE2_SPTR8 tcode;
  BOOL try_next;
  int table_limit;
  int yield;
  uint32_t c;
  BOOL utf_local;
  PCRE2_SPTR8 code_local;
  pcre2_real_code_8 *re_local;
  
  try_next = 1;
  table_limit_00 = 0x20;
  _c = code;
  if (utf != 0) {
    table_limit_00 = 0x10;
  }
  do {
    bVar1 = true;
    pbStack_40 = _c + 3;
    if ((((*_c == 0x86) || (*_c == 0x8b)) || (*_c == 0x87)) || (*_c == 0x8c)) {
      pbStack_40 = _c + 5;
    }
LAB_001486d0:
    if (bVar1) {
      p = (uint32_t *)0x0;
      switch(*pbStack_40) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x12:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1f:
      case 0x20:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x7d:
      case 0x88:
      case 0x8d:
      case 0x8e:
      case 0x8f:
      case 0x90:
      case 0x91:
      case 0x92:
      case 0x93:
      case 0x97:
      case 0x98:
      case 0x99:
      case 0x9a:
      case 0x9b:
      case 0x9c:
      case 0x9d:
      case 0x9e:
      case 0x9f:
      case 0xa0:
      case 0xa1:
      case 0xa2:
        return 0;
      case 4:
      case 5:
        pbStack_40 = pbStack_40 + 1;
        break;
      case 6:
        set_nottype_bits(re,0x40,table_limit_00);
        bVar1 = false;
        break;
      case 7:
        set_type_bits(re,0x40,table_limit_00);
        bVar1 = false;
        break;
      case 8:
        set_nottype_bits(re,0,table_limit_00);
        bVar1 = false;
        break;
      case 9:
        set_type_bits(re,0,table_limit_00);
        bVar1 = false;
        break;
      case 10:
        set_nottype_bits(re,0xa0,table_limit_00);
        bVar1 = false;
        break;
      case 0xb:
        set_type_bits(re,0xa0,table_limit_00);
        bVar1 = false;
        break;
      case 0x10:
        if (pbStack_40[1] != 9) {
          return 0;
        }
        puStack_58 = _pcre2_ucd_caseless_sets_8 + (int)(uint)pbStack_40[2];
        while( true ) {
          puVar5 = puStack_58 + 1;
          table_limit = *puStack_58;
          puStack_58 = puVar5;
          if (table_limit == 0xffffffff) break;
          if (utf != 0) {
            _pcre2_ord2utf_8(table_limit,local_5e);
            table_limit = (int)local_5e[0];
          }
          if ((uint)table_limit < 0x100) {
            re->start_bitmap[(uint)table_limit >> 3] =
                 re->start_bitmap[(uint)table_limit >> 3] | (byte)(1 << ((byte)table_limit & 7));
          }
          else {
            re->start_bitmap[0x1f] = re->start_bitmap[0x1f] | 0x80;
          }
        }
        bVar1 = false;
        break;
      case 0x11:
      case 0x15:
        re->start_bitmap[1] = re->start_bitmap[1] | 4;
        re->start_bitmap[1] = re->start_bitmap[1] | 8;
        re->start_bitmap[1] = re->start_bitmap[1] | 0x10;
        re->start_bitmap[1] = re->start_bitmap[1] | 0x20;
        if (utf == 0) {
          re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
        }
        else {
          re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
          re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
        }
        bVar1 = false;
        break;
      case 0x13:
        re->start_bitmap[1] = re->start_bitmap[1] | 2;
        re->start_bitmap[4] = re->start_bitmap[4] | 1;
        if (utf == 0) {
          re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
        }
        else {
          re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
          re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 2;
          re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
          re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 8;
        }
        bVar1 = false;
        break;
      case 0x21:
      case 0x22:
      case 0x25:
      case 0x26:
      case 0x2a:
      case 0x2c:
        pbStack_40 = set_table_bit(re,pbStack_40 + 1,0,utf);
        break;
      case 0x27:
      case 0x28:
      case 0x2d:
        pbStack_40 = set_table_bit(re,pbStack_40 + 3,0,utf);
        break;
      case 0x29:
        pbStack_40 = pbStack_40 + 2;
      case 0x1d:
      case 0x23:
      case 0x24:
      case 0x2b:
        set_table_bit(re,pbStack_40 + 1,0,utf);
        bVar1 = false;
        break;
      case 0x2e:
      case 0x2f:
      case 0x32:
      case 0x33:
      case 0x37:
      case 0x39:
        pbStack_40 = set_table_bit(re,pbStack_40 + 1,1,utf);
        break;
      case 0x34:
      case 0x35:
      case 0x3a:
        pbStack_40 = set_table_bit(re,pbStack_40 + 3,1,utf);
        break;
      case 0x36:
        pbStack_40 = pbStack_40 + 2;
      case 0x1e:
      case 0x30:
      case 0x31:
      case 0x38:
        set_table_bit(re,pbStack_40 + 1,1,utf);
        bVar1 = false;
        break;
      case 0x57:
      case 0x58:
      case 0x5f:
        pbStack_40 = pbStack_40 + 1;
        break;
      case 0x5b:
      case 0x5c:
      case 0x61:
        pbStack_40 = pbStack_40 + 2;
      case 0x55:
      case 0x56:
      case 0x59:
      case 0x5a:
      case 0x5e:
      case 0x60:
        switch(pbStack_40[1]) {
        case 6:
          set_nottype_bits(re,0x40,table_limit_00);
          break;
        case 7:
          set_type_bits(re,0x40,table_limit_00);
          break;
        case 8:
          set_nottype_bits(re,0,table_limit_00);
          break;
        case 9:
          set_type_bits(re,0,table_limit_00);
          break;
        case 10:
          set_nottype_bits(re,0xa0,table_limit_00);
          break;
        case 0xb:
          set_type_bits(re,0xa0,table_limit_00);
          break;
        case 0xc:
        case 0xd:
          return 0;
        default:
          return 0;
        case 0x11:
        case 0x15:
          re->start_bitmap[1] = re->start_bitmap[1] | 4;
          re->start_bitmap[1] = re->start_bitmap[1] | 8;
          re->start_bitmap[1] = re->start_bitmap[1] | 0x10;
          re->start_bitmap[1] = re->start_bitmap[1] | 0x20;
          if (utf == 0) {
            re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
          }
          else {
            re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
            re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
          }
          break;
        case 0x13:
          re->start_bitmap[1] = re->start_bitmap[1] | 2;
          re->start_bitmap[4] = re->start_bitmap[4] | 1;
          if (utf == 0) {
            re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
          }
          else {
            re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
            re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 2;
            re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
            re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 8;
          }
        }
        pbStack_40 = pbStack_40 + 2;
        break;
      case 0x5d:
        pbStack_40 = pbStack_40 + 3;
        break;
      default:
        return 3;
      case 0x70:
        if (((pbStack_40[3] & 4) != 0) || ((pbStack_40[3] & 3) == 1)) {
          return 0;
        }
        if ((pbStack_40[3] & 2) == 0) {
          local_80 = (uint32_t *)0x0;
        }
        else {
          local_80 = (uint32_t *)(pbStack_40 + 4);
        }
        p = local_80;
      case 0x6f:
        if (utf != 0) {
          re->start_bitmap[0x18] = re->start_bitmap[0x18] | 0xf0;
          memset(re->start_bitmap + 0x19,0xff,7);
        }
      case 0x6e:
        if (*pbStack_40 == 0x70) {
          pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[1],pbStack_40[2]);
        }
        else {
          p = (uint32_t *)(pbStack_40 + 1);
          pbStack_40 = pbStack_40 + 0x21;
        }
        if (p != (uint32_t *)0x0) {
          if (utf == 0) {
            for (table_limit = 0; (uint)table_limit < 0x20; table_limit = table_limit + 1) {
              re->start_bitmap[(uint)table_limit] =
                   re->start_bitmap[(uint)table_limit] |
                   *(byte *)((long)p + (ulong)(uint)table_limit);
            }
          }
          else {
            for (table_limit = 0; (uint)table_limit < 0x10; table_limit = table_limit + 1) {
              re->start_bitmap[(uint)table_limit] =
                   re->start_bitmap[(uint)table_limit] |
                   *(byte *)((long)p + (ulong)(uint)table_limit);
            }
            for (table_limit = 0x80; (uint)table_limit < 0x100; table_limit = table_limit + 1) {
              if (*(char *)((long)p + (ulong)((uint)table_limit >> 3)) != '\0' &&
                  1 << ((byte)table_limit & 7) != 0) {
                uVar3 = (uint)table_limit >> 6 | 0xc0;
                uVar4 = uVar3 / 8;
                re->start_bitmap[(int)uVar4] =
                     re->start_bitmap[(int)uVar4] | (byte)(1 << ((byte)uVar3 & 7));
                table_limit = (table_limit & 0xc0U) + 0x3f;
              }
            }
          }
        }
        uVar3 = (uint)*pbStack_40;
        if ((1 < uVar3 - 0x62) && (1 < uVar3 - 0x66)) {
          if (1 < uVar3 - 0x68) {
            if ((uVar3 == 0x6a) || (uVar3 == 0x6c)) goto LAB_00149081;
            if (uVar3 != 0x6d) {
              bVar1 = false;
              break;
            }
          }
          if (CONCAT11(pbStack_40[1],pbStack_40[2]) == 0) {
            pbStack_40 = pbStack_40 + 5;
          }
          else {
            bVar1 = false;
          }
          break;
        }
LAB_00149081:
        pbStack_40 = pbStack_40 + 1;
        break;
      case 0x76:
        pbStack_40 = pbStack_40 + 6;
        break;
      case 0x77:
        pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[5],pbStack_40[6]);
        break;
      case 0x78:
        try_next = 2;
        bVar1 = false;
        break;
      case 0x79:
      case 0x7a:
      case 0x7b:
      case 0x7c:
        return 2;
      case 0x7e:
      case 0x82:
      case 0x83:
      case 0x84:
      case 0x85:
      case 0x86:
      case 0x87:
      case 0x89:
      case 0x8a:
      case 0x8b:
      case 0x8c:
        iVar2 = set_start_bits(re,pbStack_40,utf);
        if (iVar2 == 0) {
          return 0;
        }
        if (iVar2 == 3) {
          return 3;
        }
        if (iVar2 == 1) {
          bVar1 = false;
        }
        else {
          do {
            pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[1],pbStack_40[2]);
          } while (*pbStack_40 == 0x78);
          pbStack_40 = pbStack_40 + 3;
        }
        break;
      case 0x7f:
      case 0x80:
      case 0x81:
        do {
          pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[1],pbStack_40[2]);
        } while (*pbStack_40 == 0x78);
        pbStack_40 = pbStack_40 + 3;
        break;
      case 0x94:
      case 0x95:
      case 0x96:
        pbStack_40 = pbStack_40 + 1;
        iVar2 = set_start_bits(re,pbStack_40,utf);
        if (iVar2 == 0) {
          return 0;
        }
        if (iVar2 == 3) {
          return 3;
        }
        do {
          pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[1],pbStack_40[2]);
        } while (*pbStack_40 == 0x78);
        pbStack_40 = pbStack_40 + 3;
        break;
      case 0xa3:
        goto switchD_00148707_caseD_a3;
      }
      goto LAB_001486d0;
    }
    _c = _c + (int)(uint)CONCAT11(_c[1],_c[2]);
    if (*_c != 'x') {
      return try_next;
    }
  } while( true );
switchD_00148707_caseD_a3:
  pbStack_40 = pbStack_40 + 1;
  do {
    pbStack_40 = pbStack_40 + (int)(uint)CONCAT11(pbStack_40[1],pbStack_40[2]);
  } while (*pbStack_40 == 0x78);
  pbStack_40 = pbStack_40 + 3;
  goto LAB_001486d0;
}

Assistant:

static int
set_start_bits(pcre2_real_code *re, PCRE2_SPTR code, BOOL utf)
{
register uint32_t c;
int yield = SSB_DONE;

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
int table_limit = utf? 16:32;
#else
int table_limit = 32;
#endif

do
  {
  BOOL try_next = TRUE;
  PCRE2_SPTR tcode = code + 1 + LINK_SIZE;

  if (*code == OP_CBRA || *code == OP_SCBRA ||
      *code == OP_CBRAPOS || *code == OP_SCBRAPOS) tcode += IMM2_SIZE;

  while (try_next)    /* Loop for items in this branch */
    {
    int rc;
    uint8_t *classmap = NULL;

    switch(*tcode)
      {
      /* If we reach something we don't understand, it means a new opcode has
      been created that hasn't been added to this function. Hopefully this
      problem will be discovered during testing. */

      default:
      return SSB_UNKNOWN;

      /* Fail for a valid opcode that implies no starting bits. */

      case OP_ACCEPT:
      case OP_ASSERT_ACCEPT:
      case OP_ALLANY:
      case OP_ANY:
      case OP_ANYBYTE:
      case OP_CIRC:
      case OP_CIRCM:
      case OP_CLOSE:
      case OP_COMMIT:
      case OP_COND:
      case OP_CREF:
      case OP_FALSE:
      case OP_TRUE:
      case OP_DNCREF:
      case OP_DNREF:
      case OP_DNREFI:
      case OP_DNRREF:
      case OP_DOLL:
      case OP_DOLLM:
      case OP_END:
      case OP_EOD:
      case OP_EODN:
      case OP_EXTUNI:
      case OP_FAIL:
      case OP_MARK:
      case OP_NOT:
      case OP_NOTEXACT:
      case OP_NOTEXACTI:
      case OP_NOTI:
      case OP_NOTMINPLUS:
      case OP_NOTMINPLUSI:
      case OP_NOTMINQUERY:
      case OP_NOTMINQUERYI:
      case OP_NOTMINSTAR:
      case OP_NOTMINSTARI:
      case OP_NOTMINUPTO:
      case OP_NOTMINUPTOI:
      case OP_NOTPLUS:
      case OP_NOTPLUSI:
      case OP_NOTPOSPLUS:
      case OP_NOTPOSPLUSI:
      case OP_NOTPOSQUERY:
      case OP_NOTPOSQUERYI:
      case OP_NOTPOSSTAR:
      case OP_NOTPOSSTARI:
      case OP_NOTPOSUPTO:
      case OP_NOTPOSUPTOI:
      case OP_NOTPROP:
      case OP_NOTQUERY:
      case OP_NOTQUERYI:
      case OP_NOTSTAR:
      case OP_NOTSTARI:
      case OP_NOTUPTO:
      case OP_NOTUPTOI:
      case OP_NOT_HSPACE:
      case OP_NOT_VSPACE:
      case OP_PRUNE:
      case OP_PRUNE_ARG:
      case OP_RECURSE:
      case OP_REF:
      case OP_REFI:
      case OP_REVERSE:
      case OP_RREF:
      case OP_SCOND:
      case OP_SET_SOM:
      case OP_SKIP:
      case OP_SKIP_ARG:
      case OP_SOD:
      case OP_SOM:
      case OP_THEN:
      case OP_THEN_ARG:
      return SSB_FAIL;

      /* A "real" property test implies no starting bits, but the fake property
      PT_CLIST identifies a list of characters. These lists are short, as they
      are used for characters with more than one "other case", so there is no
      point in recognizing them for OP_NOTPROP. */

      case OP_PROP:
      if (tcode[1] != PT_CLIST) return SSB_FAIL;
        {
        const uint32_t *p = PRIV(ucd_caseless_sets) + tcode[2];
        while ((c = *p++) < NOTACHAR)
          {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
          if (utf)
            {
            PCRE2_UCHAR buff[6];
            (void)PRIV(ord2utf)(c, buff);
            c = buff[0];
            }
#endif
          if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
          }
        }
      try_next = FALSE;
      break;

      /* We can ignore word boundary tests. */

      case OP_WORD_BOUNDARY:
      case OP_NOT_WORD_BOUNDARY:
      tcode++;
      break;

      /* If we hit a bracket or a positive lookahead assertion, recurse to set
      bits from within the subpattern. If it can't find anything, we have to
      give up. If it finds some mandatory character(s), we are done for this
      branch. Otherwise, carry on scanning after the subpattern. */

      case OP_BRA:
      case OP_SBRA:
      case OP_CBRA:
      case OP_SCBRA:
      case OP_BRAPOS:
      case OP_SBRAPOS:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      case OP_ONCE:
      case OP_ONCE_NC:
      case OP_ASSERT:
      rc = set_start_bits(re, tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      if (rc == SSB_DONE) try_next = FALSE; else
        {
        do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
        tcode += 1 + LINK_SIZE;
        }
      break;

      /* If we hit ALT or KET, it means we haven't found anything mandatory in
      this branch, though we might have found something optional. For ALT, we
      continue with the next alternative, but we have to arrange that the final
      result from subpattern is SSB_CONTINUE rather than SSB_DONE. For KET,
      return SSB_CONTINUE: if this is the top level, that indicates failure,
      but after a nested subpattern, it causes scanning to continue. */

      case OP_ALT:
      yield = SSB_CONTINUE;
      try_next = FALSE;
      break;

      case OP_KET:
      case OP_KETRMAX:
      case OP_KETRMIN:
      case OP_KETRPOS:
      return SSB_CONTINUE;

      /* Skip over callout */

      case OP_CALLOUT:
      tcode += PRIV(OP_lengths)[OP_CALLOUT];
      break;

      case OP_CALLOUT_STR:
      tcode += GET(tcode, 1 + 2*LINK_SIZE);
      break;

      /* Skip over lookbehind and negative lookahead assertions */

      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* BRAZERO does the bracket, but carries on. */

      case OP_BRAZERO:
      case OP_BRAMINZERO:
      case OP_BRAPOSZERO:
      rc = set_start_bits(re, ++tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* SKIPZERO skips the bracket. */

      case OP_SKIPZERO:
      tcode++;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* Single-char * or ? sets the bit and tries the next item */

      case OP_STAR:
      case OP_MINSTAR:
      case OP_POSSTAR:
      case OP_QUERY:
      case OP_MINQUERY:
      case OP_POSQUERY:
      tcode = set_table_bit(re, tcode + 1, FALSE, utf);
      break;

      case OP_STARI:
      case OP_MINSTARI:
      case OP_POSSTARI:
      case OP_QUERYI:
      case OP_MINQUERYI:
      case OP_POSQUERYI:
      tcode = set_table_bit(re, tcode + 1, TRUE, utf);
      break;

      /* Single-char upto sets the bit and tries the next */

      case OP_UPTO:
      case OP_MINUPTO:
      case OP_POSUPTO:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, FALSE, utf);
      break;

      case OP_UPTOI:
      case OP_MINUPTOI:
      case OP_POSUPTOI:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, TRUE, utf);
      break;

      /* At least one single char sets the bit and stops */

      case OP_EXACT:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHAR:
      case OP_PLUS:
      case OP_MINPLUS:
      case OP_POSPLUS:
      (void)set_table_bit(re, tcode + 1, FALSE, utf);
      try_next = FALSE;
      break;

      case OP_EXACTI:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHARI:
      case OP_PLUSI:
      case OP_MINPLUSI:
      case OP_POSPLUSI:
      (void)set_table_bit(re, tcode + 1, TRUE, utf);
      try_next = FALSE;
      break;

      /* Special spacing and line-terminating items. These recognize specific
      lists of characters. The difference between VSPACE and ANYNL is that the
      latter can match the two-character CRLF sequence, but that is not
      relevant for finding the first character, so their code here is
      identical. */

      case OP_HSPACE:
      SET_BIT(CHAR_HT);
      SET_BIT(CHAR_SPACE);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xA0);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+00A0 */
        SET_BIT(0xE1);  /* For U+1680, U+180E */
        SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
        SET_BIT(0xE3);  /* For U+3000 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
      the code is EBCDIC. */
        {
#ifndef EBCDIC
        SET_BIT(0xA0);
#endif  /* Not EBCDIC */
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      SET_BIT(CHAR_LF);
      SET_BIT(CHAR_VT);
      SET_BIT(CHAR_FF);
      SET_BIT(CHAR_CR);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(CHAR_NEL);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of vertical space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+0085 (NEL) */
        SET_BIT(0xE2);  /* For U+2028, U+2029 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
        {
        SET_BIT(CHAR_NEL);
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      /* Single character types set the bits and stop. Note that if PCRE2_UCP
      is set, we do not see these op codes because \d etc are converted to
      properties. Therefore, these apply in the case when only characters less
      than 256 are recognized to match the types. */

      case OP_NOT_DIGIT:
      set_nottype_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_DIGIT:
      set_type_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WHITESPACE:
      set_nottype_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_WHITESPACE:
      set_type_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WORDCHAR:
      set_nottype_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      case OP_WORDCHAR:
      set_type_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      /* One or more character type fudges the pointer and restarts, knowing
      it will hit a single character type and stop there. */

      case OP_TYPEPLUS:
      case OP_TYPEMINPLUS:
      case OP_TYPEPOSPLUS:
      tcode++;
      break;

      case OP_TYPEEXACT:
      tcode += 1 + IMM2_SIZE;
      break;

      /* Zero or more repeats of character types set the bits and then
      try again. */

      case OP_TYPEUPTO:
      case OP_TYPEMINUPTO:
      case OP_TYPEPOSUPTO:
      tcode += IMM2_SIZE;  /* Fall through */

      case OP_TYPESTAR:
      case OP_TYPEMINSTAR:
      case OP_TYPEPOSSTAR:
      case OP_TYPEQUERY:
      case OP_TYPEMINQUERY:
      case OP_TYPEPOSQUERY:
      switch(tcode[1])
        {
        default:
        case OP_ANY:
        case OP_ALLANY:
        return SSB_FAIL;

        case OP_HSPACE:
        SET_BIT(CHAR_HT);
        SET_BIT(CHAR_SPACE);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(0xA0);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+00A0 */
          SET_BIT(0xE1);  /* For U+1680, U+180E */
          SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
          SET_BIT(0xE3);  /* For U+3000 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
        the code is EBCDIC. */
          {
#ifndef EBCDIC
          SET_BIT(0xA0);
#endif  /* Not EBCDIC */
          }
#endif  /* 8-bit support */
        break;

        case OP_ANYNL:
        case OP_VSPACE:
        SET_BIT(CHAR_LF);
        SET_BIT(CHAR_VT);
        SET_BIT(CHAR_FF);
        SET_BIT(CHAR_CR);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(CHAR_NEL);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of vertical space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+0085 (NEL) */
          SET_BIT(0xE2);  /* For U+2028, U+2029 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
          {
          SET_BIT(CHAR_NEL);
          }
#endif  /* 8-bit support */
        break;

        case OP_NOT_DIGIT:
        set_nottype_bits(re, cbit_digit, table_limit);
        break;

        case OP_DIGIT:
        set_type_bits(re, cbit_digit, table_limit);
        break;

        case OP_NOT_WHITESPACE:
        set_nottype_bits(re, cbit_space, table_limit);
        break;

        case OP_WHITESPACE:
        set_type_bits(re, cbit_space, table_limit);
        break;

        case OP_NOT_WORDCHAR:
        set_nottype_bits(re, cbit_word, table_limit);
        break;

        case OP_WORDCHAR:
        set_type_bits(re, cbit_word, table_limit);
        break;
        }

      tcode += 2;
      break;

      /* Extended class: if there are any property checks, or if this is a
      negative XCLASS without a map, give up. If there are no property checks,
      there must be wide characters on the XCLASS list, because otherwise an
      XCLASS would not have been created. This means that code points >= 255
      are always potential starters. */

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if ((tcode[1 + LINK_SIZE] & XCL_HASPROP) != 0 ||
          (tcode[1 + LINK_SIZE] & (XCL_MAP|XCL_NOT)) == XCL_NOT)
        return SSB_FAIL;

      /* We have a positive XCLASS or a negative one without a map. Set up the
      map pointer if there is one, and fall through. */

      classmap = ((tcode[1 + LINK_SIZE] & XCL_MAP) == 0)? NULL :
        (uint8_t *)(tcode + 1 + LINK_SIZE + 1);
#endif

      /* Enter here for a negative non-XCLASS. In the 8-bit library, if we are
      in UTF mode, any byte with a value >= 0xc4 is a potentially valid starter
      because it starts a character with a value > 255. In 8-bit non-UTF mode,
      there is no difference between CLASS and NCLASS. In all other wide
      character modes, set the 0xFF bit to indicate code units >= 255. */

      case OP_NCLASS:
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
      if (utf)
        {
        re->start_bitmap[24] |= 0xf0;            /* Bits for 0xc4 - 0xc8 */
        memset(re->start_bitmap+25, 0xff, 7);    /* Bits for 0xc9 - 0xff */
        }
#elif PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xFF);                             /* For characters >= 255 */
#endif
      /* Fall through */

      /* Enter here for a positive non-XCLASS. If we have fallen through from
      an XCLASS, classmap will already be set; just advance the code pointer.
      Otherwise, set up classmap for a a non-XCLASS and advance past it. */

      case OP_CLASS:
      if (*tcode == OP_XCLASS) tcode += GET(tcode, 1); else
        {
        classmap = (uint8_t *)(++tcode);
        tcode += 32 / sizeof(PCRE2_UCHAR);
        }

      /* When wide characters are supported, classmap may be NULL. In UTF-8
      (sic) mode, the bits in a class bit map correspond to character values,
      not to byte values. However, the bit map we are constructing is for byte
      values. So we have to do a conversion for characters whose code point is
      greater than 127. In fact, there are only two possible starting bytes for
      characters in the range 128 - 255. */

      if (classmap != NULL)
        {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
        if (utf)
          {
          for (c = 0; c < 16; c++) re->start_bitmap[c] |= classmap[c];
          for (c = 128; c < 256; c++)
            {
            if ((classmap[c/8] && (1 << (c&7))) != 0)
              {
              int d = (c >> 6) | 0xc0;            /* Set bit for this starter */
              re->start_bitmap[d/8] |= (1 << (d&7));  /* and then skip on to the */
              c = (c & 0xc0) + 0x40 - 1;          /* next relevant character. */
              }
            }
          }
        else
#endif
        /* In all modes except UTF-8, the two bit maps are compatible. */

          {
          for (c = 0; c < 32; c++) re->start_bitmap[c] |= classmap[c];
          }
        }

      /* Act on what follows the class. For a zero minimum repeat, continue;
      otherwise stop processing. */

      switch (*tcode)
        {
        case OP_CRSTAR:
        case OP_CRMINSTAR:
        case OP_CRQUERY:
        case OP_CRMINQUERY:
        case OP_CRPOSSTAR:
        case OP_CRPOSQUERY:
        tcode++;
        break;

        case OP_CRRANGE:
        case OP_CRMINRANGE:
        case OP_CRPOSRANGE:
        if (GET2(tcode, 1) == 0) tcode += 1 + 2 * IMM2_SIZE;
          else try_next = FALSE;
        break;

        default:
        try_next = FALSE;
        break;
        }
      break; /* End of class handling case */
      }      /* End of switch for opcodes */
    }        /* End of try_next loop */

  code += GET(code, 1);   /* Advance to next branch */
  }
while (*code == OP_ALT);

return yield;
}